

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall
cppcms::application_specific_pool::~application_specific_pool(application_specific_pool *this)

{
  this->_vptr_application_specific_pool = (_func_int **)&PTR__application_specific_pool_002b3850;
  booster::hold_ptr<cppcms::application_specific_pool::_data>::~hold_ptr(&this->d);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cppcms::application_specific_pool>)._M_weak_this.
              super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

application_specific_pool::~application_specific_pool()
{
}